

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.cpp
# Opt level: O2

int test_assert_multiple(ITesting *t)

{
  kTRContinueMode kVar1;
  int iVar2;
  ITestingConfig *trConfig;
  TRUN_ConfigItem local_48;
  
  trConfig = (ITestingConfig *)0x0;
  (*t->QueryInterface)(0xc07f19,&trConfig);
  if ((trConfig == (ITestingConfig *)0x0) &&
     (kVar1 = (*t->AssertError)(0x21,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_assert.cpp"
                                ,"trConfig != nullptr"), kVar1 == kTRLeave)) {
    iVar2 = 0x10;
  }
  else {
    iVar2 = 0x10;
    local_48.name[0x1f] = '\0';
    local_48._33_3_ = 0;
    local_48.value_type = kTRCfgType_Bool;
    local_48.value.str = (char *)0x0;
    local_48.name[0xf] = '\0';
    local_48.name[0x10] = '\0';
    local_48.name[0x11] = '\0';
    local_48.name[0x12] = '\0';
    local_48.name[0x13] = '\0';
    local_48.name[0x14] = '\0';
    local_48.name[0x15] = '\0';
    local_48.name[0x16] = '\0';
    local_48.name[0x17] = '\0';
    local_48.name[0x18] = '\0';
    local_48.name[0x19] = '\0';
    local_48.name[0x1a] = '\0';
    local_48.name[0x1b] = '\0';
    local_48.name[0x1c] = '\0';
    local_48.name[0x1d] = '\0';
    local_48.name[0x1e] = '\0';
    local_48.isValid = false;
    local_48.name[0] = '\0';
    local_48.name[1] = '\0';
    local_48.name[2] = '\0';
    local_48.name[3] = '\0';
    local_48.name[4] = '\0';
    local_48.name[5] = '\0';
    local_48.name[6] = '\0';
    local_48.name[7] = '\0';
    local_48.name[8] = '\0';
    local_48.name[9] = '\0';
    local_48.name[10] = '\0';
    local_48.name[0xb] = '\0';
    local_48.name[0xc] = '\0';
    local_48.name[0xd] = '\0';
    local_48.name[0xe] = '\0';
    (*trConfig->Get)("continue_on_assert",&local_48);
    if (((local_48.isValid == true) && (local_48.value_type == kTRCfgType_Bool)) &&
       (local_48.value.boolean == 1)) {
      kVar1 = (*t->AssertError)(0x27,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_assert.cpp"
                                ,"1==2");
      if (kVar1 != kTRLeave) {
        kVar1 = (*t->AssertError)(0x28,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_assert.cpp"
                                  ,"true==false");
        iVar2 = (uint)(kVar1 == kTRLeave) << 4;
      }
    }
    else {
      (*t->Error)(0x25,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_assert.cpp"
                  ,"\"Must run with \'continue on assert\' enabled!\"");
    }
  }
  return iVar2;
}

Assistant:

DLL_EXPORT int test_assert_multiple(ITesting *t) {
    // t->SetDescription("Check if multiple assert values are allowed");

    ITestingConfig *trConfig = {};
    t->QueryInterface(ITestingConfig_IFace_ID, (void **)&trConfig);
    TR_ASSERT(t, trConfig != nullptr);
    TRUN_ConfigItem continueOnAssert = {};
    trConfig->Get("continue_on_assert", &continueOnAssert);
    // Verify - this is not an error..
    TR_REQUIRE(t, (continueOnAssert.isValid) && (continueOnAssert.value_type == kTRCfgType_Bool) && (continueOnAssert.value.boolean == true), "Must run with 'continue on assert' enabled!");

    TR_ASSERT(t, 1==2);
    TR_ASSERT(t, true==false);
    return kTR_Pass;
}